

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O2

keypress * keymap_find(int keymap,keypress kc)

{
  keymap *pkVar1;
  keymap **ppkVar2;
  
  if (1 < (uint)keymap) {
    __assert_fail("keymap >= 0 && keymap < KEYMAP_MODE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-keymap.c"
                  ,0x3f,"const struct keypress *keymap_find(int, struct keypress)");
  }
  ppkVar2 = keymaps + (uint)keymap;
  while( true ) {
    pkVar1 = *ppkVar2;
    if (pkVar1 == (keymap *)0x0) {
      return (keypress *)0x0;
    }
    if (((pkVar1->key).code == kc.code) && ((pkVar1->key).mods == kc.mods)) break;
    ppkVar2 = &pkVar1->next;
  }
  return pkVar1->actions;
}

Assistant:

const struct keypress *keymap_find(int keymap, struct keypress kc)
{
	struct keymap *k;
	assert(keymap >= 0 && keymap < KEYMAP_MODE_MAX);
	for (k = keymaps[keymap]; k; k = k->next) {
		if (k->key.code == kc.code && k->key.mods == kc.mods)
			return k->actions;
	}

	return NULL;
}